

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

void __thiscall DomResourceIcon::~DomResourceIcon(DomResourceIcon *this)

{
  DomResourcePixmap *pDVar1;
  Data *pDVar2;
  
  pDVar1 = this->m_normalOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar1 = this->m_normalOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar1 = this->m_disabledOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar1 = this->m_disabledOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar1 = this->m_activeOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar1 = this->m_activeOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar1 = this->m_selectedOff;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar1 = this->m_selectedOn;
  if (pDVar1 != (DomResourcePixmap *)0x0) {
    DomResourcePixmap::~DomResourcePixmap(pDVar1);
    operator_delete(pDVar1,0x58);
  }
  pDVar2 = (this->m_attr_resource).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_resource).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_attr_theme).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_theme).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_text).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->m_text).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

DomResourceIcon::~DomResourceIcon()
{
    delete m_normalOff;
    delete m_normalOn;
    delete m_disabledOff;
    delete m_disabledOn;
    delete m_activeOff;
    delete m_activeOn;
    delete m_selectedOff;
    delete m_selectedOn;
}